

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O2

int dlist_insl_end(dlist_head_t *head,dlist_t *dlist)

{
  int iVar1;
  
  iVar1 = 0;
  if (dlist != (dlist_t *)0x0 && head != (dlist_head_t *)0x0) {
    if ((head->dlist == (dlist_s *)0x0) || (head->end == (dlist_t *)0x0)) {
      head->dlist = dlist;
      head->end = dlist;
      head->num = 1;
      return 1;
    }
    dlist_insl_after(head,head->end,dlist);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int dlist_insl_end(dlist_head_t *head,
      dlist_t *dlist) {
   if (!head || !dlist)
      return 0;

   if (!head->dlist || !head->end) {
      head->dlist = dlist;
      head->end  = dlist;
      head->num  = 1;
      return 1;
   } else {
      return dlist_insl_after(head, head->end, dlist);
   }
}